

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct.pb.cc
# Opt level: O1

char * __thiscall google::protobuf::Value::_InternalParse(Value *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  KindUnion *this_01;
  string *psVar1;
  byte bVar2;
  byte bVar3;
  internal *this_02;
  char *size;
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  bool bVar6;
  Struct *pSVar7;
  ListValue *pLVar8;
  uint uVar9;
  char *field_name;
  uint32 uVar10;
  Arena *pAVar11;
  UnknownFieldSet *unknown;
  byte *p;
  char cVar12;
  uint res;
  char cVar13;
  pair<const_char_*,_unsigned_int> pVar14;
  pair<const_char_*,_unsigned_long> pVar15;
  StringPiece str;
  byte *local_38;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->kind_;
  local_38 = (byte *)ptr;
  do {
    bVar6 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar6) {
      return (char *)local_38;
    }
    bVar2 = *local_38;
    res = (uint)bVar2;
    p = local_38 + 1;
    if ((char)bVar2 < '\0') {
      res = ((uint)bVar2 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar14 = internal::ReadTagFallback((char *)local_38,res);
        p = (byte *)pVar14.first;
        res = pVar14.second;
      }
      else {
        p = local_38 + 2;
      }
    }
    local_38 = p;
    cVar13 = '\x04';
    if (p == (byte *)0x0) goto LAB_002efd48;
    uVar9 = (res >> 3) - 1;
    if (5 < uVar9) {
switchD_002efa4b_default:
      if (res != 0 && (res & 7) != 4) {
        if (((ulong)this_00->ptr_ & 1) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
        }
        else {
          unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
        goto LAB_002efcb5;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
      cVar13 = '\a';
      goto LAB_002efd48;
    }
    field_name = (char *)((long)&switchD_002efa4b::switchdataD_0035c828 +
                         (long)(int)(&switchD_002efa4b::switchdataD_0035c828)[uVar9]);
    cVar12 = (char)res;
    switch(res >> 3) {
    case 1:
      if (cVar12 != '\b') goto switchD_002efa4b_default;
      bVar2 = *p;
      auVar4._8_8_ = (long)(char)bVar2;
      auVar4._0_8_ = p + 1;
      auVar5 = auVar4._0_12_;
      if ((long)(char)bVar2 < 0) {
        bVar3 = p[1];
        uVar10 = ((uint)bVar3 * 0x80 + (uint)bVar2) - 0x80;
        if ((char)bVar3 < '\0') {
          pVar15 = internal::VarintParseSlow64((char *)p,uVar10);
          auVar5 = pVar15._0_12_;
        }
        else {
          auVar5._8_4_ = uVar10;
          auVar5._0_8_ = p + 2;
        }
      }
      local_38 = auVar5._0_8_;
      if (local_38 != (byte *)0x0) {
        if (this->_oneof_case_[0] != 1) {
          clear_kind(this);
          this->_oneof_case_[0] = 1;
        }
        (this->kind_).null_value_ = auVar5._8_4_;
        goto LAB_002efd42;
      }
      break;
    case 2:
      if (cVar12 != '\x11') goto switchD_002efa4b_default;
      psVar1 = *(string **)p;
      if (this->_oneof_case_[0] != 2) {
        clear_kind(this);
        this->_oneof_case_[0] = 2;
      }
      (this->kind_).string_value_.ptr_ = psVar1;
      local_38 = local_38 + 8;
LAB_002efd42:
      cVar13 = '\x02';
      break;
    case 3:
      if (cVar12 != '\x1a') goto switchD_002efa4b_default;
      if (this->_oneof_case_[0] != 3) {
        clear_kind(this);
        this->_oneof_case_[0] = 3;
        (this->kind_).struct_value_ = (Struct *)&internal::fixed_address_empty_string_abi_cxx11_;
      }
      pAVar11 = (Arena *)this_00->ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
      }
      if (this_01->struct_value_ == (Struct *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (&this_01->string_value_,pAVar11,
                   (string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      pSVar7 = this_01->struct_value_;
      local_38 = (byte *)internal::InlineGreedyStringParser((string *)pSVar7,(char *)local_38,ctx);
      this_02 = (internal *)(pSVar7->super_Message).super_MessageLite._vptr_MessageLite;
      size = (char *)(pSVar7->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
      }
      str.length_ = (stringpiece_ssize_type)"google.protobuf.Value.string_value";
      str.ptr_ = size;
      bVar6 = internal::VerifyUTF8(this_02,str,field_name);
      cVar13 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
      if (!bVar6) {
        cVar13 = '\x04';
      }
      break;
    case 4:
      if (cVar12 != ' ') goto switchD_002efa4b_default;
      bVar2 = *p;
      pVar15.second = (long)(char)bVar2;
      pVar15.first = (char *)p;
      local_38 = p + 1;
      if ((long)(char)bVar2 < 0) {
        uVar10 = ((uint)*local_38 * 0x80 + (uint)bVar2) - 0x80;
        if ((char)*local_38 < '\0') {
          local_38 = p;
          pVar15 = internal::VarintParseSlow64((char *)p,uVar10);
          local_38 = (byte *)pVar15.first;
        }
        else {
          local_38 = p + 2;
          pVar15.second._0_4_ = uVar10;
          pVar15.first = (char *)local_38;
          pVar15.second._4_4_ = 0;
        }
      }
      if (this->_oneof_case_[0] != 4) {
        clear_kind(this);
        this->_oneof_case_[0] = 4;
      }
      (this->kind_).bool_value_ = pVar15.second != 0;
      cVar13 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
      break;
    case 5:
      if (cVar12 != '*') goto switchD_002efa4b_default;
      if (this->_oneof_case_[0] != 5) {
        clear_kind(this);
        this->_oneof_case_[0] = 5;
        pAVar11 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar11 & 1) != 0) {
          pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
        }
        pSVar7 = Arena::CreateMaybeMessage<google::protobuf::Struct>(pAVar11);
        (this->kind_).struct_value_ = pSVar7;
      }
      local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Struct>
                                   (ctx,(this->kind_).struct_value_,(char *)local_38);
      goto LAB_002efcb5;
    case 6:
      if (cVar12 != '2') goto switchD_002efa4b_default;
      if (this->_oneof_case_[0] != 6) {
        clear_kind(this);
        this->_oneof_case_[0] = 6;
        pAVar11 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar11 & 1) != 0) {
          pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
        }
        pLVar8 = Arena::CreateMaybeMessage<google::protobuf::ListValue>(pAVar11);
        (this->kind_).list_value_ = pLVar8;
      }
      local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::ListValue>
                                   (ctx,(this->kind_).list_value_,(char *)local_38);
LAB_002efcb5:
      cVar13 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
    }
LAB_002efd48:
    if (cVar13 != '\x02') {
      if (cVar13 == '\x04') {
        local_38 = (byte *)0x0;
      }
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* Value::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // .google.protobuf.NullValue null_value = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_null_value(static_cast<PROTOBUF_NAMESPACE_ID::NullValue>(val));
        } else goto handle_unusual;
        continue;
      // double number_value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 17)) {
          _internal_set_number_value(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else goto handle_unusual;
        continue;
      // string string_value = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_string_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Value.string_value"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // bool bool_value = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _internal_set_bool_value(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // .google.protobuf.Struct struct_value = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_struct_value(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // .google.protobuf.ListValue list_value = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr = ctx->ParseMessage(_internal_mutable_list_value(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}